

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O0

vector<CWire_*,_std::allocator<CWire_*>_> * __thiscall
CWire::AdjustByBoundary
          (vector<CWire_*,_std::allocator<CWire_*>_> *__return_storage_ptr__,CWire *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  CLayer *pCVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  CDesign *pCVar9;
  ulong uVar10;
  CBoundary *pCVar11;
  CWire *pCVar12;
  CWire *local_f0;
  CWire *local_e8;
  CWire *pWire_1;
  uint local_d8;
  int iNEY;
  int iNSY;
  int iLast_1;
  int iZ_1;
  int iX;
  int iEY;
  int iSY;
  CLayer *local_b8;
  CLayer *pCurLayer_1;
  int local_a8;
  int j_1;
  int i_1;
  int iSum_1;
  int *pBoundary_1;
  CWire *pWire;
  uint local_88;
  int iNEX;
  int iNSX;
  int iLast;
  int iZ;
  int iY;
  int iEX;
  int iSX;
  CLayer *local_68;
  CLayer *pCurLayer;
  int local_58;
  int j;
  int i;
  int iSum;
  int *pBoundary;
  CNet *pCStack_40;
  int iNumBoundary;
  CNet *pNet;
  CLayer *pLayer;
  undefined1 local_19;
  CWire *local_18;
  CWire *this_local;
  vector<CWire_*,_std::allocator<CWire_*>_> *AdjWire;
  
  local_18 = this;
  this_local = (CWire *)__return_storage_ptr__;
  iVar5 = IsRouted(this);
  if (iVar5 == 0) {
    __assert_fail("IsRouted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x16e,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  iVar5 = IsLayerAssigned(this);
  if (iVar5 == 0) {
    __assert_fail("IsLayerAssigned()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x16f,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  local_19 = 0;
  std::vector<CWire_*,_std::allocator<CWire_*>_>::vector(__return_storage_ptr__);
  iVar5 = GetLength(this);
  std::vector<CWire_*,_std::allocator<CWire_*>_>::reserve(__return_storage_ptr__,(long)iVar5);
  pNet = (CNet *)GetLayer(this);
  if ((CLayer *)pNet == (CLayer *)0x0) {
    __assert_fail("pLayer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x175,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  pCStack_40 = GetParent(this);
  if (pCStack_40 != (CNet *)0x0) {
    pBoundary._4_4_ = 0;
    iVar5 = IsHorizontal(this);
    if (iVar5 == 0) {
      iVar5 = IsVertical(this);
      if (iVar5 == 0) {
        iVar5 = IsPoint(this);
        if (iVar5 == 0) {
          __assert_fail("IsPoint()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                        ,0x21c,"vector<CWire *> CWire::AdjustByBoundary()");
        }
        local_f0 = this;
        std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back(__return_storage_ptr__,&local_f0);
      }
      else {
        iVar5 = CPoint::Y(this->m_pPointE);
        iVar6 = CPoint::Y(this->m_pPointS);
        pBoundary._4_4_ = iVar5 - iVar6;
        if (pBoundary._4_4_ < 1) {
          __assert_fail("iNumBoundary>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                        ,0x1cd,"vector<CWire *> CWire::AdjustByBoundary()");
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)(pBoundary._4_4_ + 1);
        uVar10 = SUB168(auVar2 * ZEXT816(4),0);
        if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        _i_1 = operator_new__(uVar10);
        memset(_i_1,0,(long)pBoundary._4_4_ << 2);
        *(undefined4 *)((long)_i_1 + (long)pBoundary._4_4_ * 4) = 1;
        if (_i_1 == (void *)0x0) {
          __assert_fail("pBoundary",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                        ,0x1d2,"vector<CWire *> CWire::AdjustByBoundary()");
        }
        j_1 = 0;
        for (local_a8 = 0; local_a8 < pBoundary._4_4_; local_a8 = local_a8 + 1) {
          pCurLayer_1._4_4_ = 1;
          while( true ) {
            iVar5 = pCurLayer_1._4_4_;
            pCVar9 = CObject::GetDesign();
            iVar6 = CBBox::T(&pCVar9->super_CBBox);
            if (iVar6 < iVar5) break;
            pCVar9 = CObject::GetDesign();
            local_b8 = CDesign::GetLayer(pCVar9,pCurLayer_1._4_4_);
            iVar5 = CLayer::GetDirection(local_b8);
            iVar6 = CLayer::GetDirection((CLayer *)pNet);
            pCVar3 = local_b8;
            if (iVar5 == iVar6) {
              iVar6 = CPoint::X(this->m_pPointS);
              iVar5 = local_a8;
              iVar7 = CPoint::Y(this->m_pPointS);
              pCVar11 = CLayer::GetBoundary(pCVar3,iVar6,iVar5 + iVar7);
              uVar8 = CBoundary::IsFound(pCVar11,pCStack_40);
              *(uint *)((long)_i_1 + (long)local_a8 * 4) =
                   uVar8 | *(uint *)((long)_i_1 + (long)local_a8 * 4);
            }
            pCurLayer_1._4_4_ = pCurLayer_1._4_4_ + 1;
          }
          j_1 = *(int *)((long)_i_1 + (long)local_a8 * 4) + j_1;
        }
        if (j_1 == 0) {
          _iEY = this;
          std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back
                    (__return_storage_ptr__,(value_type *)&iEY);
        }
        else if (j_1 == pBoundary._4_4_) {
          bVar4 = std::vector<CWire_*,_std::allocator<CWire_*>_>::empty(__return_storage_ptr__);
          if (!bVar4) {
            __assert_fail("AdjWire.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                          ,0x1ec,"vector<CWire *> CWire::AdjustByBoundary()");
          }
          (this->super_CObject).m_pParent = (CObject *)0x0;
          Delete(this);
        }
        else {
          iX = CPoint::Y(this->m_pPointS);
          iZ_1 = CPoint::Y(this->m_pPointE);
          iLast_1 = CPoint::X(this->m_pPointS);
          iNSY = CPoint::Z(this->m_pPointS);
          iNEY = -1;
          for (local_a8 = 0; local_a8 < pBoundary._4_4_ + 1; local_a8 = local_a8 + 1) {
            if (*(int *)((long)_i_1 + (long)local_a8 * 4) == 0) {
              if (iNEY < 0) {
                iNEY = local_a8;
              }
            }
            else if (-1 < iNEY) {
              local_d8 = iX + iNEY;
              pWire_1._4_4_ = iX + local_a8;
              if ((int)pWire_1._4_4_ <= (int)local_d8) {
                __assert_fail("iNSY<iNEY",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                              ,0x204,"vector<CWire *> CWire::AdjustByBoundary()");
              }
              pCVar12 = (CWire *)operator_new(0x50);
              CWire(pCVar12);
              local_e8 = pCVar12;
              (*(pCVar12->super_CObject)._vptr_CObject[3])
                        (pCVar12,(ulong)(uint)iLast_1,(ulong)local_d8,(ulong)(uint)iLast_1,
                         (ulong)pWire_1._4_4_,(ulong)(uint)iNSY,this);
              std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back
                        (__return_storage_ptr__,&local_e8);
              iNEY = -1;
            }
          }
          (this->super_CObject).m_pParent = (CObject *)0x0;
          Delete(this);
        }
        if ((_i_1 != (void *)0x0) && (_i_1 != (void *)0x0)) {
          operator_delete__(_i_1);
        }
      }
    }
    else {
      iVar6 = CPoint::X(this->m_pPointE);
      iVar5 = CPoint::X(this->m_pPointS);
      iVar6 = iVar6 - iVar5;
      bVar4 = false;
      pBoundary._4_4_ = iVar6;
      if (0 < iVar6) {
        pCVar9 = CObject::GetDesign();
        iVar7 = CBBox::W(&pCVar9->super_CBBox);
        iVar5 = pBoundary._4_4_;
        bVar4 = true;
        if (iVar7 < iVar6) {
          pCVar9 = CObject::GetDesign();
          iVar6 = CBBox::H(&pCVar9->super_CBBox);
          bVar4 = iVar5 <= iVar6;
        }
      }
      if (!bVar4) {
        __assert_fail("iNumBoundary>0&&(iNumBoundary<=GetDesign()->W()||iNumBoundary<=GetDesign()->H())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x17d,"vector<CWire *> CWire::AdjustByBoundary()");
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(pBoundary._4_4_ + 1);
      uVar10 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      _i = operator_new__(uVar10);
      if (_i == (void *)0x0) {
        __assert_fail("pBoundary",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x180,"vector<CWire *> CWire::AdjustByBoundary()");
      }
      memset(_i,0,(long)pBoundary._4_4_ << 2);
      *(undefined4 *)((long)_i + (long)pBoundary._4_4_ * 4) = 1;
      j = 0;
      for (local_58 = 0; local_58 < pBoundary._4_4_; local_58 = local_58 + 1) {
        pCurLayer._4_4_ = 1;
        while( true ) {
          iVar5 = pCurLayer._4_4_;
          pCVar9 = CObject::GetDesign();
          iVar6 = CBBox::T(&pCVar9->super_CBBox);
          if (iVar6 < iVar5) break;
          pCVar9 = CObject::GetDesign();
          local_68 = CDesign::GetLayer(pCVar9,pCurLayer._4_4_);
          iVar6 = CLayer::GetDirection(local_68);
          iVar7 = CLayer::GetDirection((CLayer *)pNet);
          iVar5 = local_58;
          pCVar3 = local_68;
          if (iVar6 == iVar7) {
            iVar6 = CPoint::X(this->m_pPointS);
            iVar7 = CPoint::Y(this->m_pPointS);
            pCVar11 = CLayer::GetBoundary(pCVar3,iVar5 + iVar6,iVar7);
            uVar8 = CBoundary::IsFound(pCVar11,pCStack_40);
            *(uint *)((long)_i + (long)local_58 * 4) =
                 uVar8 | *(uint *)((long)_i + (long)local_58 * 4);
          }
          pCurLayer._4_4_ = pCurLayer._4_4_ + 1;
        }
        j = *(int *)((long)_i + (long)local_58 * 4) + j;
      }
      if (j == 0) {
        _iEX = this;
        std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back
                  (__return_storage_ptr__,(value_type *)&iEX);
      }
      else if (j == pBoundary._4_4_) {
        bVar4 = std::vector<CWire_*,_std::allocator<CWire_*>_>::empty(__return_storage_ptr__);
        if (!bVar4) {
          __assert_fail("AdjWire.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                        ,0x19e,"vector<CWire *> CWire::AdjustByBoundary()");
        }
        (this->super_CObject).m_pParent = (CObject *)0x0;
        Delete(this);
      }
      else {
        iY = CPoint::X(this->m_pPointS);
        iZ = CPoint::X(this->m_pPointE);
        iLast = CPoint::Y(this->m_pPointS);
        iNSX = CPoint::Z(this->m_pPointS);
        iNEX = -1;
        for (local_58 = 0; local_58 < pBoundary._4_4_ + 1; local_58 = local_58 + 1) {
          if (*(int *)((long)_i + (long)local_58 * 4) == 0) {
            if (iNEX < 0) {
              iNEX = local_58;
            }
          }
          else if (-1 < iNEX) {
            local_88 = iY + iNEX;
            pWire._4_4_ = iY + local_58;
            pCVar12 = (CWire *)operator_new(0x50);
            CWire(pCVar12);
            pBoundary_1 = (int *)pCVar12;
            (*(pCVar12->super_CObject)._vptr_CObject[3])
                      (pCVar12,(ulong)local_88,(ulong)(uint)iLast,(ulong)pWire._4_4_,
                       (ulong)(uint)iLast,(ulong)(uint)iNSX,this);
            std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back
                      (__return_storage_ptr__,(value_type *)&pBoundary_1);
            iNEX = -1;
          }
        }
        (this->super_CObject).m_pParent = (CObject *)0x0;
        Delete(this);
      }
      if ((_i != (void *)0x0) && (_i != (void *)0x0)) {
        operator_delete__(_i);
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("pNet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                ,0x177,"vector<CWire *> CWire::AdjustByBoundary()");
}

Assistant:

vector<CWire*> CWire::AdjustByBoundary()
{
	assert(IsRouted());
	assert(IsLayerAssigned());

	vector<CWire*>		AdjWire;
	AdjWire.reserve(GetLength());

	CLayer*	pLayer		=	GetLayer();
	assert(pLayer);
	CNet*	pNet		=	GetParent();
	assert(pNet);

	int	iNumBoundary	=	0;
	if(IsHorizontal())
	{
		iNumBoundary			=	m_pPointE->X()-m_pPointS->X();
		assert(iNumBoundary>0&&(iNumBoundary<=GetDesign()->W()||iNumBoundary<=GetDesign()->H()));

		int*	pBoundary		=	new	int[iNumBoundary+1];
		assert(pBoundary);

		memset(pBoundary,0x00,iNumBoundary*sizeof(int));
		pBoundary[iNumBoundary]	=	1;	// mark as the last element [7/5/2006 thyeros]

		int	iSum	=	0;
		int	i,j;
		for (i=0;i<iNumBoundary;++i)
		{
			for (j=1;j<=GetDesign()->T();++j)
			{
				CLayer*	pCurLayer	=	GetDesign()->GetLayer(j);

				if(pCurLayer->GetDirection()==pLayer->GetDirection())
				{
					pBoundary[i]	|=	pCurLayer->GetBoundary(i+m_pPointS->X(),m_pPointS->Y())->IsFound(pNet);	
				}
			}

			iSum	+=	pBoundary[i];
		}

		if(iSum==0)
		{	
			// whole wire is needed [7/5/2006 thyeros]
			AdjWire.push_back(this);
		}
		else if(iSum==iNumBoundary)
		{
			// already wires are there, discard this wire [7/5/2006 thyeros]
			assert(AdjWire.empty());

			m_pParent	=	NULL;
			Delete();//delete	this;
		}
		else
		{
			// partially needed [7/5/2006 thyeros]
			int	iSX		=	m_pPointS->X();
			int	iEX		=	m_pPointE->X();
			int	iY		=	m_pPointS->Y();
			int	iZ		=	m_pPointS->Z();

			int	iLast	=	-1;
			for (i=0;i<iNumBoundary+1;++i)
			{
				if(pBoundary[i])
				{
					if(iLast>=0)
					{
						// create wire between iLast and i [7/5/2006 thyeros]
						int	iNSX	=	iSX+iLast;
						int	iNEX	=	iSX+i;
						
						CWire*	pWire	=	new CWire;
						pWire->Initialize(iNSX,iY,iNEX,iY,iZ,this);
						
						AdjWire.push_back(pWire);
						
						iLast	=	-1;
					}
				}
				else
				{
					if(iLast<0)		iLast	=	i;
				}
			}

			m_pParent	=	NULL;
			Delete();//delete	this;
		}

		SAFE_DELA(pBoundary);
	}
	else if(IsVertical())
	{
		iNumBoundary	=	m_pPointE->Y()-m_pPointS->Y();
		assert(iNumBoundary>0);

		int*	pBoundary		=	new	int[iNumBoundary+1];
		memset(pBoundary,0x00,iNumBoundary*sizeof(int));
		pBoundary[iNumBoundary]	=	1;	// mark as the last element [7/5/2006 thyeros]
		assert(pBoundary);

		int	iSum	=	0;
		int	i,j;
		for (i=0;i<iNumBoundary;++i)
		{
			for (j=1;j<=GetDesign()->T();++j)
			{
				CLayer*	pCurLayer	=	GetDesign()->GetLayer(j);

				if(pCurLayer->GetDirection()==pLayer->GetDirection())
				{
					pBoundary[i]	|=	pCurLayer->GetBoundary(m_pPointS->X(),i+m_pPointS->Y())->IsFound(pNet);	
				}
			}
			iSum	+=	pBoundary[i];
		}

		if(iSum==0)
		{	
			// whole wire is needed [7/5/2006 thyeros]
			AdjWire.push_back(this);
		}
		else if(iSum==iNumBoundary)
		{
			// already wires are there, discard this wire [7/5/2006 thyeros]
			assert(AdjWire.empty());

			m_pParent	=	NULL;
			Delete();//delete	this;
		}
		else
		{
			// partially needed [7/5/2006 thyeros]
			int	iSY		=	m_pPointS->Y();
			int	iEY		=	m_pPointE->Y();
			int	iX		=	m_pPointS->X();
			int	iZ		=	m_pPointS->Z();

			int	iLast	=	-1;
			for (i=0;i<iNumBoundary+1;++i)
			{
				if(pBoundary[i])
				{
					if(iLast>=0)
					{
						// create wire between iLast and i [7/5/2006 thyeros]
						int	iNSY	=	iSY+iLast;
						int	iNEY	=	iSY+i;
						
						assert(iNSY<iNEY);
						
						CWire*	pWire	=	new CWire;
						pWire->Initialize(iX,iNSY,iX,iNEY,iZ,this);
						
						AdjWire.push_back(pWire);
						
						iLast	=	-1;	
					}				
				}
				else
				{
					if(iLast<0)		iLast	=	i;
				}
			}

			m_pParent	=	NULL;
			Delete();//delete	this;
		}

		SAFE_DELA(pBoundary);
	}
	else
	{
		assert(IsPoint());
		AdjWire.push_back(this);
	}

	return	AdjWire;
}